

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VirtualMemory_unix.cpp
# Opt level: O0

void * xmrig::VirtualMemory::allocateExecutableMemory(size_t size)

{
  size_t in_RDI;
  void *mem;
  void *local_18;
  
  local_18 = mmap((void *)0x0,in_RDI,7,0x22,-1,0);
  if (local_18 == (void *)0xffffffffffffffff) {
    local_18 = (void *)0x0;
  }
  return local_18;
}

Assistant:

void *xmrig::VirtualMemory::allocateExecutableMemory(size_t size)
{
#   if defined(__APPLE__)
    void *mem = mmap(0, size, PROT_READ | PROT_WRITE | PROT_EXEC, MAP_PRIVATE | MAP_ANON, -1, 0);
#   else
    void *mem = mmap(0, size, PROT_READ | PROT_WRITE | PROT_EXEC, MAP_PRIVATE | MAP_ANONYMOUS, -1, 0);
#   endif

    return mem == MAP_FAILED ? nullptr : mem;
}